

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.h
# Opt level: O2

void __thiscall winmd::reader::database::database(database *this,string_view *path,cache *cache)

{
  table_base *ptVar1;
  allocator<char> local_29;
  
  (this->TypeRef).super_table_base.m_database = this;
  (this->TypeRef).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->TypeRef).super_table_base;
  (this->TypeRef).super_table_base.m_row_count = 0;
  (this->TypeRef).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->TypeRef).super_table_base.m_columns._M_elems[1].offset = '\0';
  *(undefined8 *)((long)&(this->TypeRef).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->TypeRef).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->GenericParamConstraint).super_table_base.m_database = this;
  (this->GenericParamConstraint).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->GenericParamConstraint).super_table_base;
  (this->GenericParamConstraint).super_table_base.m_row_count = 0;
  (this->GenericParamConstraint).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->GenericParamConstraint).super_table_base.m_columns._M_elems[1].offset = '\0';
  *(undefined8 *)((long)&(this->GenericParamConstraint).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->GenericParamConstraint).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->TypeSpec).super_table_base.m_database = this;
  (this->TypeSpec).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->TypeSpec).super_table_base;
  (this->TypeSpec).super_table_base.m_row_count = 0;
  (this->TypeSpec).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->TypeSpec).super_table_base.m_columns._M_elems[1].offset = '\0';
  *(undefined8 *)((long)&(this->TypeSpec).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->TypeSpec).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->TypeDef).super_table_base.m_database = this;
  (this->TypeDef).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->TypeDef).super_table_base;
  (this->TypeDef).super_table_base.m_row_count = 0;
  (this->TypeDef).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->TypeDef).super_table_base.m_columns._M_elems[1].offset = '\0';
  *(undefined8 *)((long)&(this->TypeDef).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->TypeDef).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->CustomAttribute).super_table_base.m_database = this;
  (this->CustomAttribute).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->CustomAttribute).super_table_base;
  (this->CustomAttribute).super_table_base.m_row_count = 0;
  (this->CustomAttribute).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->CustomAttribute).super_table_base.m_columns._M_elems[1].offset = '\0';
  *(undefined8 *)((long)&(this->CustomAttribute).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->CustomAttribute).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->MethodDef).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->MethodDef).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->MethodDef).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->MethodDef).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->MethodDef).super_table_base;
  (this->MethodDef).super_table_base.m_row_count = 0;
  (this->MethodDef).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->MethodDef).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->MemberRef).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->MemberRef).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->MemberRef).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->MemberRef).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->MemberRef).super_table_base;
  (this->MemberRef).super_table_base.m_row_count = 0;
  (this->MemberRef).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->MemberRef).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->Module).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->Module).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->Module).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->Module).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->Module).super_table_base;
  (this->Module).super_table_base.m_row_count = 0;
  (this->Module).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->Module).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->Param).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->Param).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->Param).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->Param).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->Param).super_table_base;
  (this->Param).super_table_base.m_row_count = 0;
  (this->Param).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->Param).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->InterfaceImpl).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->InterfaceImpl).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->InterfaceImpl).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->InterfaceImpl).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->InterfaceImpl).super_table_base;
  (this->InterfaceImpl).super_table_base.m_row_count = 0;
  (this->InterfaceImpl).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->InterfaceImpl).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->Constant).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->Constant).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->Constant).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->Constant).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->Constant).super_table_base;
  (this->Constant).super_table_base.m_row_count = 0;
  (this->Constant).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->Constant).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->Field).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->Field).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->Field).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->Field).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->Field).super_table_base;
  (this->Field).super_table_base.m_row_count = 0;
  (this->Field).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->Field).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->FieldMarshal).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->FieldMarshal).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->FieldMarshal).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->FieldMarshal).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->FieldMarshal).super_table_base;
  (this->FieldMarshal).super_table_base.m_row_count = 0;
  (this->FieldMarshal).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->FieldMarshal).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->DeclSecurity).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->DeclSecurity).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->DeclSecurity).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->DeclSecurity).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->DeclSecurity).super_table_base;
  (this->DeclSecurity).super_table_base.m_row_count = 0;
  (this->DeclSecurity).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->DeclSecurity).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->ClassLayout).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->ClassLayout).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->ClassLayout).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->ClassLayout).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->ClassLayout).super_table_base;
  (this->ClassLayout).super_table_base.m_row_count = 0;
  (this->ClassLayout).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->ClassLayout).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->FieldLayout).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->FieldLayout).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->FieldLayout).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->FieldLayout).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->FieldLayout).super_table_base;
  (this->FieldLayout).super_table_base.m_row_count = 0;
  (this->FieldLayout).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->FieldLayout).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->StandAloneSig).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->StandAloneSig).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->StandAloneSig).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->StandAloneSig).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->StandAloneSig).super_table_base;
  (this->StandAloneSig).super_table_base.m_row_count = 0;
  (this->StandAloneSig).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->StandAloneSig).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->EventMap).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->EventMap).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->EventMap).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->EventMap).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->EventMap).super_table_base;
  (this->EventMap).super_table_base.m_row_count = 0;
  (this->EventMap).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->EventMap).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->Event).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->Event).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->Event).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->Event).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->Event).super_table_base;
  (this->Event).super_table_base.m_row_count = 0;
  (this->Event).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->Event).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->PropertyMap).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->PropertyMap).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->PropertyMap).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->PropertyMap).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->PropertyMap).super_table_base;
  (this->PropertyMap).super_table_base.m_row_count = 0;
  (this->PropertyMap).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->PropertyMap).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->Property).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->Property).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->Property).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->Property).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->Property).super_table_base;
  (this->Property).super_table_base.m_row_count = 0;
  (this->Property).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->Property).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->MethodSemantics).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->MethodSemantics).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->MethodSemantics).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->MethodSemantics).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->MethodSemantics).super_table_base;
  (this->MethodSemantics).super_table_base.m_row_count = 0;
  (this->MethodSemantics).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->MethodSemantics).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->MethodImpl).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->MethodImpl).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->MethodImpl).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->MethodImpl).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->MethodImpl).super_table_base;
  (this->MethodImpl).super_table_base.m_row_count = 0;
  (this->MethodImpl).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->MethodImpl).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->ModuleRef).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->ModuleRef).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->ModuleRef).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->ModuleRef).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->ModuleRef).super_table_base;
  (this->ModuleRef).super_table_base.m_row_count = 0;
  (this->ModuleRef).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->ModuleRef).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->ImplMap).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->ImplMap).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->ImplMap).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->ImplMap).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->ImplMap).super_table_base;
  (this->ImplMap).super_table_base.m_row_count = 0;
  (this->ImplMap).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->ImplMap).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->FieldRVA).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->FieldRVA).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->FieldRVA).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->FieldRVA).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->FieldRVA).super_table_base;
  (this->FieldRVA).super_table_base.m_row_count = 0;
  (this->FieldRVA).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->FieldRVA).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->Assembly).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->Assembly).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->Assembly).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->Assembly).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->Assembly).super_table_base;
  (this->Assembly).super_table_base.m_row_count = 0;
  (this->Assembly).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->Assembly).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->AssemblyProcessor).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->AssemblyProcessor).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->AssemblyProcessor).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->AssemblyProcessor).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->AssemblyProcessor).super_table_base;
  (this->AssemblyProcessor).super_table_base.m_row_count = 0;
  (this->AssemblyProcessor).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->AssemblyProcessor).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->AssemblyOS).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->AssemblyOS).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->AssemblyOS).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->AssemblyOS).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->AssemblyOS).super_table_base;
  (this->AssemblyOS).super_table_base.m_row_count = 0;
  (this->AssemblyOS).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->AssemblyOS).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->AssemblyRef).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->AssemblyRef).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->AssemblyRef).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->AssemblyRef).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->AssemblyRef).super_table_base;
  (this->AssemblyRef).super_table_base.m_row_count = 0;
  (this->AssemblyRef).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->AssemblyRef).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->AssemblyRefProcessor).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->AssemblyRefProcessor).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->AssemblyRefProcessor).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->AssemblyRefProcessor).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->AssemblyRefProcessor).super_table_base;
  (this->AssemblyRefProcessor).super_table_base.m_row_count = 0;
  (this->AssemblyRefProcessor).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->AssemblyRefProcessor).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->AssemblyRefOS).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->AssemblyRefOS).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->AssemblyRefOS).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->AssemblyRefOS).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->AssemblyRefOS).super_table_base;
  (this->AssemblyRefOS).super_table_base.m_row_count = 0;
  (this->AssemblyRefOS).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->AssemblyRefOS).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->File).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->File).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->File).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->File).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->File).super_table_base;
  (this->File).super_table_base.m_row_count = 0;
  (this->File).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->File).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->ExportedType).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->ExportedType).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->ExportedType).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->ExportedType).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->ExportedType).super_table_base;
  (this->ExportedType).super_table_base.m_row_count = 0;
  (this->ExportedType).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->ExportedType).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->ManifestResource).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->ManifestResource).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->ManifestResource).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->ManifestResource).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->ManifestResource).super_table_base;
  (this->ManifestResource).super_table_base.m_row_count = 0;
  (this->ManifestResource).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->ManifestResource).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->NestedClass).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->NestedClass).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->NestedClass).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->NestedClass).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->NestedClass).super_table_base;
  (this->NestedClass).super_table_base.m_row_count = 0;
  (this->NestedClass).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->NestedClass).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->GenericParam).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->GenericParam).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->GenericParam).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->GenericParam).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->GenericParam).super_table_base;
  (this->GenericParam).super_table_base.m_row_count = 0;
  (this->GenericParam).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->GenericParam).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->MethodSpec).super_table_base.m_database = this;
  *(undefined8 *)((long)&(this->MethodSpec).super_table_base.m_row_count + 1) = 0;
  ptVar1 = &(this->MethodSpec).super_table_base;
  (ptVar1->m_columns)._M_elems[2].offset = '\0';
  (ptVar1->m_columns)._M_elems[2].size = '\0';
  (ptVar1->m_columns)._M_elems[3].offset = '\0';
  (ptVar1->m_columns)._M_elems[3].size = '\0';
  (ptVar1->m_columns)._M_elems[4].offset = '\0';
  (ptVar1->m_columns)._M_elems[4].size = '\0';
  (ptVar1->m_columns)._M_elems[5].offset = '\0';
  (ptVar1->m_columns)._M_elems[5].size = '\0';
  (this->MethodSpec).super_table_base.m_data = (uint8_t *)0x0;
  ptVar1 = &(this->MethodSpec).super_table_base;
  (this->MethodSpec).super_table_base.m_row_count = 0;
  (this->MethodSpec).super_table_base.m_row_size = '\0';
  (ptVar1->m_columns)._M_elems[0].offset = '\0';
  (ptVar1->m_columns)._M_elems[0].size = '\0';
  (this->MethodSpec).super_table_base.m_columns._M_elems[1].offset = '\0';
  (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  file_view::file_view(&this->m_view,path);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->m_path,path,&local_29);
  (this->m_guids).m_first = (uint8_t *)0x0;
  (this->m_guids).m_last = (uint8_t *)0x0;
  (this->m_blobs).m_first = (uint8_t *)0x0;
  (this->m_blobs).m_last = (uint8_t *)0x0;
  (this->m_strings).m_first = (uint8_t *)0x0;
  (this->m_strings).m_last = (uint8_t *)0x0;
  this->m_cache = cache;
  initialize(this);
  return;
}

Assistant:

explicit database(std::string_view const& path, cache const* cache = nullptr) : m_view{ path }, m_path{ path }, m_cache{ cache }
        {
            initialize();
        }